

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Nonnull<CordRepBtree_*> absl::lts_20250127::ForceBtree(CordRep *rep)

{
  byte bVar1;
  CordRep *pCVar2;
  CordRepBtree *pCVar3;
  uint8_t uVar4;
  CordRep *rep_00;
  CordRep *local_20;
  
  if (rep->tag != '\x03') {
    if (rep == (CordRep *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                    ,0x37,"CordRep *absl::cord_internal::RemoveCrcNode(CordRep *)");
    }
    rep_00 = rep;
    if (rep->tag == '\x02') {
      ForceBtree();
      rep_00 = local_20;
    }
    if (rep_00 == (CordRep *)0x0) {
      __assert_fail("edge != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                    ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
    }
    bVar1 = rep_00->tag;
    if (bVar1 < 5) {
      pCVar2 = rep_00;
      if (bVar1 == 1) {
        pCVar2 = *(CordRep **)&rep_00[1].refcount;
      }
      if (pCVar2->tag < 5) {
        pCVar3 = cord_internal::CordRepBtree::CreateSlow(rep_00);
        return pCVar3;
      }
    }
    rep = (CordRep *)operator_new(0x40);
    (((Nonnull<CordRepBtree_*>)rep)->super_CordRep).refcount.count_.super___atomic_base<int>._M_i =
         2;
    if (bVar1 == 3) {
      uVar4 = rep_00->storage[0] + '\x01';
    }
    else {
      uVar4 = '\0';
    }
    (((Nonnull<CordRepBtree_*>)rep)->super_CordRep).length = rep_00->length;
    (((Nonnull<CordRepBtree_*>)rep)->super_CordRep).tag = '\x03';
    (((Nonnull<CordRepBtree_*>)rep)->super_CordRep).storage[0] = uVar4;
    (((Nonnull<CordRepBtree_*>)rep)->super_CordRep).storage[1] = '\0';
    (((Nonnull<CordRepBtree_*>)rep)->super_CordRep).storage[2] = '\x01';
    ((Nonnull<CordRepBtree_*>)rep)->edges_[0] = rep_00;
  }
  return (Nonnull<CordRepBtree_*>)rep;
}

Assistant:

static absl::Nonnull<CordRepBtree*> ForceBtree(CordRep* rep) {
  return rep->IsBtree()
             ? rep->btree()
             : CordRepBtree::Create(cord_internal::RemoveCrcNode(rep));
}